

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O2

void __thiscall SM83::jr_r8<(SM83::Conditions)1>(SM83 *this)

{
  u8 uVar1;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_std::basic_string_view<char>,_const_unsigned_short_&>
  fmt;
  undefined6 uStack_28;
  u16 new_pc;
  unsigned_short local_20 [4];
  char *local_18;
  
  uVar1 = GetByteFromPC(this);
  new_pc = (short)(char)uVar1 + this->pc;
  local_20 = (unsigned_short  [4])0x1;
  local_18 = "C";
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x4d;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,std::basic_string_view<char,std::char_traits<char>>,unsigned_short_const&>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  JR {}, 0x{:04X}\n"
             ,fmt,&(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,local_20,
             (basic_string_view<char,_std::char_traits<char>_> *)&new_pc,
             (unsigned_short *)CONCAT26(new_pc,uStack_28));
  if (((this->field_0).field_1.f & 0x10) != 0) {
    this->pc = new_pc;
    Timer::AdvanceCycles(this->timer,4);
  }
  return;
}

Assistant:

void SM83::jr_r8() {
    const s8 offset = static_cast<s8>(GetByteFromPC());
    const u16 new_pc = pc + offset;

    if constexpr (cond == Conditions::None) {
        LTRACE("JR 0x{:04X}", new_pc);
    } else {
        LTRACE("JR {}, 0x{:04X}", GetConditionString<cond>(), new_pc);
    }

    if (MeetsCondition<cond>()) {
        pc = new_pc;
        timer.AdvanceCycles(4);
    }
}